

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

CURLUcode curl_url_get(CURLU *u,CURLUPart what,char **part,uint flags)

{
  int iVar1;
  CURLcode CVar2;
  char *plus;
  char *pcVar3;
  Curl_handler *pCVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  CURLUcode CVar8;
  char *pcVar9;
  char *pcVar10;
  char *scheme;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  byte bVar16;
  char *pcVar17;
  byte bVar18;
  char *pcVar19;
  bool bVar20;
  bool bVar21;
  char *local_70;
  char portbuf [7];
  char *decoded;
  size_t dlen;
  
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  if (part == (char **)0x0) {
    return CURLUE_BAD_PARTPOINTER;
  }
  *part = (char *)0x0;
  if (CURLUPART_FRAGMENT < what) {
    return CURLUE_UNKNOWN_PART;
  }
  bVar16 = (byte)flags >> 6;
  switch(what) {
  case CURLUPART_URL:
    pcVar3 = u->options;
    pcVar6 = u->port;
    if ((u->scheme == (char *)0x0) || (iVar1 = Curl_strcasecompare("file",u->scheme), iVar1 == 0)) {
      if (u->host == (char *)0x0) {
        return CURLUE_NO_HOST;
      }
      scheme = u->scheme;
      if (scheme == (char *)0x0) {
        if ((flags & 4) == 0) {
          return CURLUE_NO_SCHEME;
        }
        scheme = "https";
      }
      pCVar4 = Curl_builtin_scheme(scheme);
      if ((flags & 1) == 0 || pcVar6 != (char *)0x0) {
        if (pCVar4 == (Curl_handler *)0x0 || pcVar6 == (char *)0x0) {
          if (pCVar4 == (Curl_handler *)0x0) goto LAB_001419e1;
        }
        else {
          pcVar7 = (char *)0x0;
          if (pCVar4->defport != u->portnum) {
            pcVar7 = pcVar6;
          }
          if ((flags & 2) != 0) {
            pcVar6 = pcVar7;
          }
        }
LAB_001419cf:
        if ((pCVar4->flags & 0x400) == 0) {
          pcVar3 = (char *)0x0;
        }
      }
      else {
        if (pCVar4 != (Curl_handler *)0x0) {
          curl_msnprintf(portbuf,7,"%ld",pCVar4->defport);
          pcVar6 = portbuf;
          goto LAB_001419cf;
        }
        pcVar6 = (char *)0x0;
      }
LAB_001419e1:
      pcVar7 = u->user;
      pcVar11 = u->password;
      bVar20 = pcVar11 == (char *)0x0;
      pcVar13 = ":";
      pcVar5 = ":";
      if (bVar20) {
        pcVar5 = "";
        pcVar11 = "";
      }
      bVar21 = pcVar3 == (char *)0x0;
      pcVar12 = ";";
      if (bVar21) {
        pcVar12 = "";
        pcVar3 = "";
      }
      pcVar15 = "@";
      if (bVar21) {
        pcVar15 = "";
      }
      if (!bVar20) {
        pcVar15 = "@";
      }
      if (pcVar7 == (char *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar15 = "@";
      }
      if (pcVar6 == (char *)0x0) {
        pcVar13 = "";
        pcVar6 = "";
      }
      pcVar17 = u->path;
      if (pcVar17 == (char *)0x0) {
        pcVar17 = "/";
        local_70 = "";
      }
      else {
        local_70 = "/";
        if (*pcVar17 == '/') {
          local_70 = "";
        }
      }
      pcVar19 = u->query;
      pcVar9 = "";
      pcVar10 = "";
      if ((pcVar19 != (char *)0x0) && (pcVar9 = "?", pcVar10 = pcVar19, *pcVar19 == '\0')) {
        pcVar9 = "";
        pcVar10 = "";
      }
      pcVar19 = u->fragment;
      pcVar14 = "#";
      if (pcVar19 == (char *)0x0) {
        pcVar14 = "";
        pcVar19 = "";
      }
      pcVar3 = curl_maprintf("%s://%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s",scheme,pcVar7,pcVar5,pcVar11,
                             pcVar12,pcVar3,pcVar15,u->host,pcVar13,pcVar6,local_70,pcVar17,pcVar9,
                             pcVar10,pcVar14,pcVar19);
    }
    else {
      pcVar3 = u->fragment;
      pcVar6 = "#";
      if (pcVar3 == (char *)0x0) {
        pcVar6 = "";
        pcVar3 = "";
      }
      pcVar3 = curl_maprintf("file://%s%s%s",u->path,pcVar6,pcVar3);
    }
    if (pcVar3 == (char *)0x0) {
      return CURLUE_OUT_OF_MEMORY;
    }
    *part = pcVar3;
    goto LAB_00141b18;
  case CURLUPART_SCHEME:
    CVar8 = CURLUE_NO_SCHEME;
    bVar16 = 0;
    break;
  case CURLUPART_USER:
    u = (CURLU *)&u->user;
    CVar8 = CURLUE_NO_USER;
    break;
  case CURLUPART_PASSWORD:
    u = (CURLU *)&u->password;
    CVar8 = CURLUE_NO_PASSWORD;
    break;
  case CURLUPART_OPTIONS:
    u = (CURLU *)&u->options;
    CVar8 = CURLUE_NO_OPTIONS;
    break;
  case CURLUPART_HOST:
    u = (CURLU *)&u->host;
    CVar8 = CURLUE_NO_HOST;
    break;
  case CURLUPART_PORT:
    pcVar3 = u->port;
    if ((flags & 1) == 0 || pcVar3 != (char *)0x0) {
      if (pcVar3 == (char *)0x0) {
        return CURLUE_NO_PORT;
      }
      if ((u->scheme != (char *)0x0) &&
         (pCVar4 = Curl_builtin_scheme(u->scheme), pCVar4 != (Curl_handler *)0x0)) {
        if ((flags & 2) == 0) {
          bVar16 = 0;
          goto LAB_001417c9;
        }
        bVar16 = 0;
        bVar18 = 0;
        if (pCVar4->defport == u->portnum) {
          return CURLUE_NO_PORT;
        }
        goto LAB_001417e8;
      }
    }
    else {
      if (u->scheme == (char *)0x0) {
        return CURLUE_NO_PORT;
      }
      pCVar4 = Curl_builtin_scheme(u->scheme);
      if (pCVar4 == (Curl_handler *)0x0) {
        return CURLUE_NO_PORT;
      }
      pcVar3 = portbuf;
      curl_msnprintf(pcVar3,7,"%ld",pCVar4->defport);
    }
    bVar18 = 0;
    bVar16 = 0;
    goto LAB_001417e8;
  case CURLUPART_PATH:
    pcVar3 = u->path;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)("/");
      u->path = pcVar3;
      if (pcVar3 == (char *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
    }
LAB_001417c9:
    bVar18 = 0;
    goto LAB_001417e8;
  case CURLUPART_QUERY:
    u = (CURLU *)&u->query;
    CVar8 = CURLUE_NO_QUERY;
    bVar18 = bVar16;
    goto LAB_001417e0;
  case CURLUPART_FRAGMENT:
    u = (CURLU *)&u->fragment;
    CVar8 = CURLUE_NO_FRAGMENT;
  }
  bVar18 = 0;
LAB_001417e0:
  pcVar3 = u->scheme;
  if (pcVar3 != (char *)0x0) {
LAB_001417e8:
    pcVar3 = (*Curl_cstrdup)(pcVar3);
    *part = pcVar3;
    CVar8 = CURLUE_OUT_OF_MEMORY;
    if (pcVar3 != (char *)0x0) {
      if ((bVar18 & 1) != 0) {
        do {
          if (*pcVar3 == '+') {
            *pcVar3 = ' ';
          }
          else if (*pcVar3 == '\0') break;
          pcVar3 = pcVar3 + 1;
        } while( true );
      }
      if ((bVar16 & 1) != 0) {
        CVar2 = Curl_urldecode((Curl_easy *)0x0,*part,0,&decoded,&dlen,true);
        (*Curl_cfree)(*part);
        pcVar3 = (char *)0x0;
        if (CVar2 == CURLE_OK) {
          pcVar3 = decoded;
        }
        *part = pcVar3;
        if (CVar2 != CURLE_OK) {
          return CURLUE_URLDECODE;
        }
      }
LAB_00141b18:
      CVar8 = CURLUE_OK;
    }
  }
  return CVar8;
}

Assistant:

CURLUcode curl_url_get(CURLU *u, CURLUPart what,
                       char **part, unsigned int flags)
{
  char *ptr;
  CURLUcode ifmissing = CURLUE_UNKNOWN_PART;
  char portbuf[7];
  bool urldecode = (flags & CURLU_URLDECODE)?1:0;
  bool plusdecode = FALSE;
  (void)flags;
  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part)
    return CURLUE_BAD_PARTPOINTER;
  *part = NULL;

  switch(what) {
  case CURLUPART_SCHEME:
    ptr = u->scheme;
    ifmissing = CURLUE_NO_SCHEME;
    urldecode = FALSE; /* never for schemes */
    break;
  case CURLUPART_USER:
    ptr = u->user;
    ifmissing = CURLUE_NO_USER;
    break;
  case CURLUPART_PASSWORD:
    ptr = u->password;
    ifmissing = CURLUE_NO_PASSWORD;
    break;
  case CURLUPART_OPTIONS:
    ptr = u->options;
    ifmissing = CURLUE_NO_OPTIONS;
    break;
  case CURLUPART_HOST:
    ptr = u->host;
    ifmissing = CURLUE_NO_HOST;
    break;
  case CURLUPART_PORT:
    ptr = u->port;
    ifmissing = CURLUE_NO_PORT;
    urldecode = FALSE; /* never for port */
    if(!ptr && (flags & CURLU_DEFAULT_PORT) && u->scheme) {
      /* there's no stored port number, but asked to deliver
         a default one for the scheme */
      const struct Curl_handler *h =
        Curl_builtin_scheme(u->scheme);
      if(h) {
        msnprintf(portbuf, sizeof(portbuf), "%ld", h->defport);
        ptr = portbuf;
      }
    }
    else if(ptr && u->scheme) {
      /* there is a stored port number, but ask to inhibit if
         it matches the default one for the scheme */
      const struct Curl_handler *h =
        Curl_builtin_scheme(u->scheme);
      if(h && (h->defport == u->portnum) &&
         (flags & CURLU_NO_DEFAULT_PORT))
        ptr = NULL;
    }
    break;
  case CURLUPART_PATH:
    ptr = u->path;
    if(!ptr) {
      ptr = u->path = strdup("/");
      if(!u->path)
        return CURLUE_OUT_OF_MEMORY;
    }
    break;
  case CURLUPART_QUERY:
    ptr = u->query;
    ifmissing = CURLUE_NO_QUERY;
    plusdecode = urldecode;
    break;
  case CURLUPART_FRAGMENT:
    ptr = u->fragment;
    ifmissing = CURLUE_NO_FRAGMENT;
    break;
  case CURLUPART_URL: {
    char *url;
    char *scheme;
    char *options = u->options;
    char *port = u->port;
    if(u->scheme && strcasecompare("file", u->scheme)) {
      url = aprintf("file://%s%s%s",
                    u->path,
                    u->fragment? "#": "",
                    u->fragment? u->fragment : "");
    }
    else if(!u->host)
      return CURLUE_NO_HOST;
    else {
      const struct Curl_handler *h = NULL;
      if(u->scheme)
        scheme = u->scheme;
      else if(flags & CURLU_DEFAULT_SCHEME)
        scheme = (char *) DEFAULT_SCHEME;
      else
        return CURLUE_NO_SCHEME;

      if(scheme) {
        h = Curl_builtin_scheme(scheme);
        if(!port && (flags & CURLU_DEFAULT_PORT)) {
          /* there's no stored port number, but asked to deliver
             a default one for the scheme */
          if(h) {
            msnprintf(portbuf, sizeof(portbuf), "%ld", h->defport);
            port = portbuf;
          }
        }
        else if(port) {
          /* there is a stored port number, but asked to inhibit if it matches
             the default one for the scheme */
          if(h && (h->defport == u->portnum) &&
             (flags & CURLU_NO_DEFAULT_PORT))
            port = NULL;
        }
      }
      if(h && !(h->flags & PROTOPT_URLOPTIONS))
        options = NULL;

      url = aprintf("%s://%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s",
                    scheme,
                    u->user ? u->user : "",
                    u->password ? ":": "",
                    u->password ? u->password : "",
                    options ? ";" : "",
                    options ? options : "",
                    (u->user || u->password || options) ? "@": "",
                    u->host,
                    port ? ":": "",
                    port ? port : "",
                    (u->path && (u->path[0] != '/')) ? "/": "",
                    u->path ? u->path : "/",
                    (u->query && u->query[0]) ? "?": "",
                    (u->query && u->query[0]) ? u->query : "",
                    u->fragment? "#": "",
                    u->fragment? u->fragment : "");
    }
    if(!url)
      return CURLUE_OUT_OF_MEMORY;
    *part = url;
    return CURLUE_OK;
    break;
  }
  default:
    ptr = NULL;
  }
  if(ptr) {
    *part = strdup(ptr);
    if(!*part)
      return CURLUE_OUT_OF_MEMORY;
    if(plusdecode) {
      /* convert + to space */
      char *plus;
      for(plus = *part; *plus; ++plus) {
        if(*plus == '+')
          *plus = ' ';
      }
    }
    if(urldecode) {
      char *decoded;
      size_t dlen;
      CURLcode res = Curl_urldecode(NULL, *part, 0, &decoded, &dlen, TRUE);
      free(*part);
      if(res) {
        *part = NULL;
        return CURLUE_URLDECODE;
      }
      *part = decoded;
    }
    return CURLUE_OK;
  }
  else
    return ifmissing;
}